

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

double __thiscall soplex::SPxSolverBase<double>::value(SPxSolverBase<double> *this)

{
  double *pdVar1;
  VectorBase<double> *vec;
  UpdateVector<double> *this_00;
  double dVar2;
  double local_18;
  double local_10;
  
  if (this->initialized == false) {
    ::soplex::infinity::__tls_init();
    pdVar1 = (double *)__tls_get_addr(&PTR_003b4b70);
    return *pdVar1;
  }
  if (this->theRep == ROW) {
    local_18 = (double)(this->super_SPxLPBase<double>).thesense;
    if (this->theType == LEAVE) {
      dVar2 = VectorBase<double>::operator*
                        (&this->theCoPvec->super_VectorBase<double>,this->theFrhs);
      goto LAB_001de988;
    }
    local_10 = nonbasicValue(this);
    vec = this->theFrhs;
    this_00 = this->theCoPvec;
  }
  else {
    local_18 = (double)(this->super_SPxLPBase<double>).thesense;
    local_10 = nonbasicValue(this);
    this_00 = this->theFvec;
    vec = this->theCoPrhs;
  }
  dVar2 = VectorBase<double>::operator*(&this_00->super_VectorBase<double>,vec);
  dVar2 = dVar2 + local_10;
LAB_001de988:
  return dVar2 * local_18 + (this->super_SPxLPBase<double>).offset;
}

Assistant:

R SPxSolverBase<R>::value()
   {
      assert(isInitialized());

      R x;

      // calling value() without having a suitable status is an error.
      if(!isInitialized())
         return R(infinity);

      if(rep() == ROW)
      {
         if(type() == LEAVE)
            x = int(SPxLPBase<R>::spxSense()) * (coPvec() *
                                                 fRhs()); // the contribution of maxRowObj() is missing
         else
            x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + (coPvec() * fRhs()));
      }
      else
         x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + fVec() * coPrhs());

      return x + this->objOffset();
   }